

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# depspawn.cpp
# Opt level: O3

bool __thiscall depspawn::internal::arg_info::overlap_array(arg_info *this,arg_info *other)

{
  char cVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  ulong uVar5;
  
  cVar1 = this->rank;
  do {
    if ((this->wr != false) || (other->wr == true)) {
      if (cVar1 < '\x01') {
        uVar5 = 0;
      }
      else {
        uVar5 = 0;
        while( true ) {
          iVar2 = this->array_range[uVar5].first;
          iVar3 = other->array_range[uVar5].first;
          bVar4 = iVar3 <= this->array_range[uVar5].second;
          if (iVar3 < iVar2) {
            bVar4 = iVar2 <= other->array_range[uVar5].second;
          }
          if (!bVar4) break;
          uVar5 = uVar5 + 1;
          if ((uint)(int)cVar1 == uVar5) {
            return true;
          }
        }
      }
      if ((uint)uVar5 == (int)cVar1) {
        return true;
      }
    }
    other = other->next;
  } while ((other != (arg_info *)0x0) && (this->addr == other->addr));
  return false;
}

Assistant:

bool arg_info::overlap_array(const arg_info *other) const
    { int i;

      const int lim = rank;
      
      do {
	
	if(wr || other->wr) {
	  //if(data != other->data) return false; SHOULD be ==
	  
	  assert(lim == other->rank);
	  
	  for(i = 0; i < lim; i++) {
	    if(!overlaps_intervals(std::get<0>(array_range[i]), std::get<1>(array_range[i]),
				   std::get<0>(other->array_range[i]), std::get<1>(other->array_range[i])))
	      break;
	  }
	  
	  if(i == lim) {
	    //if(depspawn::debug) std::cout << "DEP FOUND\n";
	    return true;
	  }
	}
	
	other = other->next;
	
      } while(other && (addr == other->addr));
      
      return false;
    }